

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressBegin_usingDict_deprecated
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,int compressionLevel)

{
  size_t sVar1;
  ZSTD_compressionParameters cParams;
  
  ZSTD_getCParams_internal
            (&cParams,compressionLevel,0xffffffffffffffff,dictSize,ZSTD_cpm_noAttachDict);
  memset((ZSTD_CCtx_params *)&cParams,0,0xd8);
  cParams.chainLog = cParams.windowLog;
  cParams.strategy = cParams.targetLength;
  sVar1 = ZSTD_compressBegin_internal
                    (cctx,dict,dictSize,ZSTD_dct_auto,ZSTD_dtlm_fast,(ZSTD_CDict *)0x0,
                     (ZSTD_CCtx_params *)&cParams,0xffffffffffffffff,ZSTDb_not_buffered);
  return sVar1;
}

Assistant:

static size_t
ZSTD_compressBegin_usingDict_deprecated(ZSTD_CCtx* cctx, const void* dict, size_t dictSize, int compressionLevel)
{
    ZSTD_CCtx_params cctxParams;
    {   ZSTD_parameters const params = ZSTD_getParams_internal(compressionLevel, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_noAttachDict);
        ZSTD_CCtxParams_init_internal(&cctxParams, &params, (compressionLevel == 0) ? ZSTD_CLEVEL_DEFAULT : compressionLevel);
    }
    DEBUGLOG(4, "ZSTD_compressBegin_usingDict (dictSize=%u)", (unsigned)dictSize);
    return ZSTD_compressBegin_internal(cctx, dict, dictSize, ZSTD_dct_auto, ZSTD_dtlm_fast, NULL,
                                       &cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, ZSTDb_not_buffered);
}